

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMathematics.cpp
# Opt level: O1

double chrono::ChNoise(double x,double amp,double freq,int octaves,double amp_ratio)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined8 in_XMM0_Qb;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  uVar4 = CH_PAseed;
  if (octaves < 1) {
    dVar11 = 0.0;
  }
  else {
    dVar11 = 0.0;
    do {
      dVar12 = 1.0 / freq;
      auVar15._0_8_ = x / dVar12;
      auVar15._8_8_ = in_XMM0_Qb;
      auVar15 = vroundsd_avx(auVar15,auVar15,9);
      iVar10 = (int)auVar15._0_8_;
      if (CH_PAseed != 0) {
        CH_PAseed = (ulong)(iVar10 + 0x3039);
      }
      lVar5 = ((long)(CH_PAseed ^ 0x75bd924) / 0x1f31d) * -0x7fffffff +
              (CH_PAseed ^ 0x75bd924) * 0x41a7;
      lVar6 = lVar5 + 0x7fffffff;
      if (-1 < lVar5) {
        lVar6 = lVar5;
      }
      lVar5 = (lVar6 / 0x1f31d) * -0x7fffffff + lVar6 * 0x41a7;
      lVar6 = lVar5 + 0x7fffffff;
      if (-1 < lVar5) {
        lVar6 = lVar5;
      }
      lVar5 = (lVar6 / 0x1f31d) * -0x7fffffff + lVar6 * 0x41a7;
      lVar6 = lVar5 + 0x7fffffff;
      if (-1 < lVar5) {
        lVar6 = lVar5;
      }
      lVar5 = (lVar6 / 0x1f31d) * -0x7fffffff + lVar6 * 0x41a7;
      lVar6 = lVar5 + 0x7fffffff;
      if (-1 < lVar5) {
        lVar6 = lVar5;
      }
      if (lVar6 == 0x75bd924) {
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)(iVar10 + 0x303a);
      }
      dVar13 = dVar12 * auVar15._0_8_;
      lVar7 = ((long)(uVar9 ^ 0x75bd924) / 0x1f31d) * -0x7fffffff + (uVar9 ^ 0x75bd924) * 0x41a7;
      lVar5 = lVar7 + 0x7fffffff;
      if (-1 < lVar7) {
        lVar5 = lVar7;
      }
      lVar7 = (lVar5 / 0x1f31d) * -0x7fffffff + lVar5 * 0x41a7;
      lVar5 = lVar7 + 0x7fffffff;
      if (-1 < lVar7) {
        lVar5 = lVar7;
      }
      dVar3 = amp * ((double)lVar6 * 4.656612875245797e-10 + -0.5);
      lVar5 = (lVar5 / 0x1f31d) * -0x7fffffff + lVar5 * 0x41a7;
      lVar6 = lVar5 + 0x7fffffff;
      if (-1 < lVar5) {
        lVar6 = lVar5;
      }
      uVar8 = (lVar6 / 0x1f31d) * -0x7fffffff + lVar6 * 0x41a7;
      uVar9 = uVar8 + 0x7fffffff;
      if (-1 < (long)uVar8) {
        uVar9 = uVar8;
      }
      CH_PAseed = uVar9 ^ 0x75bd924;
      dVar12 = (x - dVar13) / ((dVar12 + dVar13) - dVar13);
      dVar13 = pow(dVar12,3.0);
      in_XMM0_Qb = 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = dVar12 * dVar12;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar13 * -2.0;
      auVar15 = vfmadd231sd_fma(auVar14,ZEXT816(0x4008000000000000),auVar1);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar3;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = amp * ((double)(long)uVar9 * 4.656612875245797e-10 + -0.5) - dVar3;
      auVar15 = vfmadd132sd_fma(auVar15,auVar16,auVar2);
      dVar11 = dVar11 + auVar15._0_8_;
      amp = amp * amp_ratio;
      freq = freq + freq;
      octaves = octaves + -1;
    } while (octaves != 0);
  }
  CH_PAseed = uVar4;
  return dVar11;
}

Assistant:

double ChNoise(double x, double amp, double freq, int octaves, double amp_ratio) {
    double ret = 0;
    long oldseed = CH_PAseed;
    double o_freq, o_amp, xA, xB, yA, yB, period;
    int iA, iB;

    o_freq = freq;
    o_amp = amp;

    for (int i = 1; i <= octaves; i++) {
        period = 1.0 / o_freq;
        xA = period * floor(x / period);
        xB = xA + period;
        iA = int(floor(x / period));
        iB = iA + 1;
        ChSetRandomSeed((long)(iA + 12345));
        ChRandom();
        ChRandom();
        ChRandom();  // just to puzzle the seed..
        yA = (ChRandom() - 0.5) * o_amp;
        ChSetRandomSeed((long)(iB + 12345));
        ChRandom();
        ChRandom();
        ChRandom();  // just to puzzle the seed..
        yB = (ChRandom() - 0.5) * o_amp;
        // cubic noise interpolation from (xA,yA) to (xB,yB), with flat extremal derivatives
        ret += yA + (yB - yA) * ((3 * (pow(((x - xA) / (xB - xA)), 2))) - 2 * (pow(((x - xA) / (xB - xA)), 3)));
        // for following octave, reduce amplitude...
        o_amp *= amp_ratio;
        o_freq *= 2.0;
    }
    // restore previous seed
    CH_PAseed = oldseed;
    return ret;
}